

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Node __thiscall xt::vector::doAssoc(vector *this,uint level,Node *node,uint i,Object *val)

{
  vector *this_00;
  element_type *peVar1;
  _Node *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Object *this_01;
  long lVar3;
  uint uVar4;
  Object *o;
  Node NVar5;
  Node local_d0;
  double local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  vector *local_a0;
  Node *local_98;
  Object local_90;
  Object local_70;
  Object local_50;
  
  __p = (_Node *)operator_new(0x10);
  new_object_array((xt *)&local_b0,0x20);
  (__p->array).
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b0;
  (__p->array).
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_a8;
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
    }
  }
  *(_Node **)this = __p;
  this_00 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
  local_a0 = this_00;
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  peVar1 = (((node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->array).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  o = *(Object **)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl;
  lVar3 = (long)*(pointer *)
                 ((long)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>).
                         _M_impl + 8) - (long)o >> 5;
  local_98 = node;
  if (0 < lVar3) {
    this_01 = *(Object **)**(undefined8 **)this;
    lVar3 = lVar3 + 1;
    do {
      Object::operator=(this_01,o);
      o = o + 1;
      this_01 = this_01 + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  if (level == 0) {
    Object::operator=((Object *)((ulong)((i & 0x1f) << 5) + *(long *)**(undefined8 **)this),val);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    uVar4 = i >> ((byte)level & 0x1f) & 0x1f;
    Object::Object(&local_70,
                   (Object *)
                   ((ulong)(uVar4 << 5) +
                   *(long *)&(((((local_98->
                                 super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                               ->array).
                               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)
                             ._M_impl));
    local_d0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_70.field_2.number;
    local_d0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_70.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
      }
    }
    Object::Object(&local_50,val);
    doAssoc((vector *)&local_c0,level - 5,&local_d0,i,&local_50);
    local_90.type = Pointer;
    local_90.typeinfo = (TypeInfo *)_Node::type_info;
    local_90.field_2.number = local_c0;
    local_90.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_b8._M_pi;
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      }
    }
    Object::operator=((Object *)((ulong)(uVar4 << 5) + *(long *)**(undefined8 **)this),&local_90);
    _Var2._M_pi = extraout_RDX_00;
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
      _Var2._M_pi = extraout_RDX_01;
    }
    if (local_d0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      _Var2._M_pi = extraout_RDX_02;
    }
  }
  NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar5.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node doAssoc(unsigned int level, Node node, unsigned int i, Object val) {
	Node ret = Node(new _Node {new_object_array(32)});
	std::copy(node->array->begin(), node->array->end(), ret->array->begin());
	if (level == 0)
		(*ret->array)[i & 0x01f] = val;
	else {
		unsigned int subidx = (i >> level) & 0x01f;
		(*ret->array)[subidx] = doAssoc(level - 5, to_node((*node->array)[subidx]), i, val);
	}
	return ret;
}